

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O3

bool tinyusdz::tydra::anon_unknown_0::ComputeNormals
               (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *vertices,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexCounts,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices,
               vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *normals,
               string *err)

{
  undefined8 uVar1;
  pointer puVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  string *psVar7;
  pointer pcVar8;
  pointer pcVar9;
  pointer paVar10;
  ulong uVar11;
  pointer pcVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  float3 fVar16;
  uint32_t vidx2;
  uint32_t vidx1;
  uint32_t vidx0;
  size_t nv;
  ostringstream ss_e;
  undefined1 local_238 [12];
  undefined4 uStack_22c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  string *local_218;
  undefined1 local_210 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  unsigned_long local_1f0;
  undefined1 local_1e4 [8];
  undefined1 local_1dc [28];
  undefined1 local_1c0 [24];
  value_type local_1a8 [9];
  ios_base local_138 [264];
  
  local_1a8[0]._M_elems[0] = 0.0;
  local_1a8[0]._M_elems[1] = 0.0;
  local_1a8[0]._M_elems[2] = 0.0;
  local_218 = err;
  local_1dc._4_8_ = faceVertexIndices;
  ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::_M_fill_assign
            (normals,((long)(vertices->
                            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(vertices->
                            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,
             local_1a8);
  local_1dc._12_8_ = 0;
  puVar2 = (faceVertexCounts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_start;
  local_1dc._20_8_ = faceVertexCounts;
  if ((faceVertexCounts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    pcVar8 = (pointer)0x0;
    do {
      uVar1 = local_1dc._12_8_;
      pcVar12 = (pointer)(ulong)puVar2[local_1dc._12_8_];
      local_1c0._0_8_ = pcVar12;
      if (pcVar12 < (pointer)0x3) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                   ,0x5b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ComputeNormals",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x8c2);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        local_210._0_8_ = &local_200;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_210,"Invalid face num {} at faceVertexCounts[{}]","");
        fmt::format<unsigned_long,unsigned_long>
                  ((string *)local_238,(fmt *)local_210,(string *)local_1c0,
                   (unsigned_long *)(local_1dc + 0xc),(unsigned_long *)err);
        poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_238._0_8_,
                            CONCAT44(uStack_22c,local_238._8_4_));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        goto LAB_003418d8;
      }
      puVar2 = (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_1dc._4_8_)->
               _M_impl).super__Vector_impl_data._M_start;
      local_1dc._0_4_ = puVar2[(long)pcVar8];
      uVar5 = (ulong)(uint)local_1dc._0_4_;
      local_1e4._4_4_ = puVar2[(long)(pcVar8 + 1)];
      uVar4 = (ulong)(uint)local_1e4._4_4_;
      local_1e4._0_4_ = puVar2[(long)(pcVar8 + 2)];
      uVar6 = (ulong)(uint)local_1e4._0_4_;
      paVar10 = (vertices->
                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      err = (string *)0xaaaaaaaaaaaaaaab;
      uVar11 = ((long)(vertices->
                      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)paVar10 >> 2) *
               -0x5555555555555555;
      if (uVar11 < uVar5 || uVar11 - uVar5 == 0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                   ,0x5b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ComputeNormals",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x8cd);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        local_210._0_8_ = &local_200;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_210,"vertexIndex0 {} exceeds vertices.size {}","");
        local_1f0 = ((long)(vertices->
                           super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(vertices->
                           super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
        psVar7 = (string *)local_1dc;
LAB_00341d31:
        fmt::format<unsigned_int,unsigned_long>
                  ((string *)local_238,(fmt *)local_210,psVar7,(uint *)&local_1f0,
                   (unsigned_long *)err);
LAB_003418b2:
        poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_238._0_8_,
                            CONCAT44(uStack_22c,local_238._8_4_));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
LAB_003418d8:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._0_8_ != &local_228) {
          operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
        }
        psVar7 = local_218;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._0_8_ != &local_200) {
          operator_delete((void *)local_210._0_8_,local_200._M_allocated_capacity + 1);
        }
        if (psVar7 != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)psVar7,local_238._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._0_8_ != &local_228) {
            operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        ::std::ios_base::~ios_base(local_138);
        return false;
      }
      if (uVar11 < uVar4 || uVar11 - uVar4 == 0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                   ,0x5b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ComputeNormals",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x8d2);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        local_210._0_8_ = &local_200;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_210,"vertexIndex1 {} exceeds vertices.size {}","");
        local_1f0 = ((long)(vertices->
                           super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(vertices->
                           super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
        psVar7 = (string *)(local_1e4 + 4);
        goto LAB_00341d31;
      }
      if (uVar11 < uVar6 || uVar11 - uVar6 == 0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                   ,0x5b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ComputeNormals",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x8d7);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        local_210._0_8_ = &local_200;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_210,"vertexIndex2 {} exceeds vertices.size {}","");
        local_1f0 = ((long)(vertices->
                           super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(vertices->
                           super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
        psVar7 = (string *)local_1e4;
        goto LAB_00341d31;
      }
      fVar15 = (float)*(undefined8 *)paVar10[uVar5]._M_elems;
      fVar14 = (float)((ulong)*(undefined8 *)paVar10[uVar5]._M_elems >> 0x20);
      local_238._0_8_ =
           CONCAT44((float)((ulong)*(undefined8 *)paVar10[uVar4]._M_elems >> 0x20) - fVar14,
                    (float)*(undefined8 *)paVar10[uVar4]._M_elems - fVar15);
      local_238._8_4_ = paVar10[uVar4]._M_elems[2] - paVar10[uVar5]._M_elems[2];
      local_210._0_8_ =
           CONCAT44((float)((ulong)*(undefined8 *)paVar10[uVar6]._M_elems >> 0x20) - fVar14,
                    (float)*(undefined8 *)paVar10[uVar6]._M_elems - fVar15);
      local_210._8_4_ = paVar10[uVar6]._M_elems[2] - paVar10[uVar5]._M_elems[2];
      fVar16 = vcross((float3 *)local_238,(float3 *)local_210);
      local_1a8[0]._M_elems[2] = fVar16._M_elems[2];
      local_1a8[0]._M_elems._0_8_ = fVar16._M_elems._0_8_;
      local_1c0._8_4_ = vlength(local_1a8);
      fVar16 = vnormalize(local_1a8,1.1920929e-07);
      puVar2 = (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_1dc._4_8_)->
               _M_impl).super__Vector_impl_data._M_start;
      fVar15 = (float)local_1c0._8_4_ * 0.5;
      uVar5 = ((long)(vertices->
                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(vertices->
                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
      paVar10 = (normals->
                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pcVar9 = (pointer)0x0;
      do {
        uVar4 = (ulong)puVar2[(long)(pcVar9 + (long)pcVar8)];
        if (uVar5 < uVar4 || uVar5 - uVar4 == 0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                     ,0x5b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ComputeNormals",0xe);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x8e2);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          local_210._0_8_ = &local_200;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_210,"vertexIndex exceeds vertices.size {}","");
          local_1f0 = ((long)(vertices->
                             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(vertices->
                             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
          fmt::format<unsigned_long>((string *)local_238,(string *)local_210,&local_1f0);
          goto LAB_003418b2;
        }
        *(ulong *)paVar10[uVar4]._M_elems =
             CONCAT44((float)((ulong)*(undefined8 *)paVar10[uVar4]._M_elems >> 0x20) +
                      fVar15 * fVar16._M_elems[1],
                      (float)*(undefined8 *)paVar10[uVar4]._M_elems + fVar15 * fVar16._M_elems[0]);
        paVar10[uVar4]._M_elems[2] = paVar10[uVar4]._M_elems[2] + fVar15 * fVar16._M_elems[2];
        pcVar9 = pcVar9 + 1;
      } while (pcVar12 != pcVar9);
      pcVar8 = pcVar8 + (long)pcVar12;
      local_1dc._12_8_ = uVar1 + 1;
      puVar2 = *(pointer *)local_1dc._20_8_;
    } while ((ulong)local_1dc._12_8_ <
             (ulong)((long)*(pointer *)(local_1dc._20_8_ + 8) - (long)puVar2 >> 2));
  }
  paVar10 = (normals->
            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((normals->super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != paVar10) {
    lVar13 = 0;
    uVar5 = 0;
    do {
      fVar16 = vnormalize((float3 *)((long)paVar10->_M_elems + lVar13),1.1920929e-07);
      paVar10 = (normals->
                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      *(long *)((long)paVar10->_M_elems + lVar13) = fVar16._M_elems._0_8_;
      *(float *)((long)paVar10->_M_elems + lVar13 + 8) = fVar16._M_elems[2];
      uVar5 = uVar5 + 1;
      paVar10 = (normals->
                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar13 = lVar13 + 0xc;
    } while (uVar5 < (ulong)(((long)(normals->
                                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)paVar10 >> 2
                             ) * -0x5555555555555555));
  }
  return true;
}

Assistant:

static bool ComputeNormals(const std::vector<vec3> &vertices,
                           const std::vector<uint32_t> &faceVertexCounts,
                           const std::vector<uint32_t> &faceVertexIndices,
                           std::vector<vec3> &normals, std::string *err) {
  normals.assign(vertices.size(), {0.0f, 0.0f, 0.0f});

  size_t faceVertexIndexOffset{0};
  for (size_t f = 0; f < faceVertexCounts.size(); f++) {
    size_t nv = faceVertexCounts[f];

    if (nv < 3) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Invalid face num {} at faceVertexCounts[{}]", nv, f));
    }

    // For quad/polygon, first three vertices are used to compute face normal
    // (Assume quad/polygon plane is co-planar)
    uint32_t vidx0 = faceVertexIndices[faceVertexIndexOffset + 0];
    uint32_t vidx1 = faceVertexIndices[faceVertexIndexOffset + 1];
    uint32_t vidx2 = faceVertexIndices[faceVertexIndexOffset + 2];

    if (vidx0 >= vertices.size()) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("vertexIndex0 {} exceeds vertices.size {}", vidx0, vertices.size()));
    }

    if (vidx1 >= vertices.size()) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("vertexIndex1 {} exceeds vertices.size {}", vidx1, vertices.size()));
    }

    if (vidx2 >= vertices.size()) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("vertexIndex2 {} exceeds vertices.size {}", vidx2, vertices.size()));
    }

    float area{0.0f};
    value::float3 Nf = GeometricNormal(vertices[vidx0], vertices[vidx1],
                                       vertices[vidx2], area);

    for (size_t v = 0; v < nv; v++) {
      uint32_t vidx = faceVertexIndices[faceVertexIndexOffset + v];
      if (vidx >= vertices.size()) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "vertexIndex exceeds vertices.size {}", vertices.size()));
      }
      normals[vidx] += area * Nf;
    }

    faceVertexIndexOffset += nv;
  }

  for (size_t v = 0; v < normals.size(); v++) {
    normals[v] = vnormalize(normals[v]);
  }

  return true;
}